

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

void duckdb::ApproxQuantileListOperation<duckdb::hugeint_t>::
     Finalize<duckdb::list_entry_t,duckdb::ApproxQuantileState>
               (ApproxQuantileState *state,list_entry_t *target,AggregateFinalizeData *finalize_data
               )

{
  AggregateInputData *this;
  FunctionData *pFVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  uint64_t uVar6;
  reference pvVar7;
  int64_t iVar8;
  size_type __n;
  ulong uVar9;
  hugeint_t *phVar10;
  Value VVar11;
  
  if (state->pos != 0) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar1 = (this->bind_data).ptr;
    lVar5 = duckdb::ListVector::GetEntry(finalize_data->result);
    uVar6 = duckdb::ListVector::GetListSize(finalize_data->result);
    duckdb::ListVector::Reserve
              (finalize_data->result,(*(long *)(pFVar1 + 0x10) - *(long *)(pFVar1 + 8) >> 2) + uVar6
              );
    lVar5 = *(long *)(lVar5 + 0x20);
    duckdb_tdigest::TDigest::process(state->h);
    target->offset = uVar6;
    lVar2 = *(long *)(pFVar1 + 0x10);
    lVar3 = *(long *)(pFVar1 + 8);
    uVar9 = lVar2 - lVar3 >> 2;
    target->length = uVar9;
    if (lVar2 != lVar3) {
      phVar10 = (hugeint_t *)(lVar5 + uVar6 * 0x10);
      __n = 0;
      do {
        pvVar7 = vector<float,_true>::operator[]((vector<float,_true> *)(pFVar1 + 8),__n);
        VVar11 = duckdb_tdigest::TDigest::quantile(state->h,(double)*pvVar7);
        bVar4 = duckdb::TryCast::Operation<double,duckdb::hugeint_t>(VVar11,phVar10,false);
        if (!bVar4) {
          iVar8 = -0x8000000000000000;
          if (0.0 <= VVar11) {
            iVar8 = 0x7fffffffffffffff;
          }
          phVar10->lower = -(ulong)(0.0 <= VVar11);
          phVar10->upper = iVar8;
        }
        __n = __n + 1;
        uVar9 = target->length;
        phVar10 = phVar10 + 1;
      } while (__n < uVar9);
    }
    duckdb::ListVector::SetListSize(finalize_data->result,uVar9 + target->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, RESULT_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ApproximateQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		D_ASSERT(state.h);
		state.h->compress();

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			const auto &source = state.h->quantile(quantile);
			auto &target = rdata[ridx + q];
			ApproxQuantileCoding::Decode(source, target);
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}